

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::Coroutine<kj::HttpInputStream::Request>::fulfill
          (Coroutine<kj::HttpInputStream::Request> *this,
          FixVoid<kj::HttpInputStream::Request> *value)

{
  bool bVar1;
  Request *value_00;
  ExceptionOr<kj::HttpInputStream::Request> local_1e8;
  Request *local_18;
  FixVoid<kj::HttpInputStream::Request> *value_local;
  Coroutine<kj::HttpInputStream::Request> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<kj::HttpInputStream::Request> *)this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<kj::HttpInputStream::Request>(local_18);
    ExceptionOr<kj::HttpInputStream::Request>::ExceptionOr(&local_1e8,value_00);
    ExceptionOr<kj::HttpInputStream::Request>::operator=(&this->result,&local_1e8);
    ExceptionOr<kj::HttpInputStream::Request>::~ExceptionOr(&local_1e8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }